

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_windowing.cc
# Opt level: O2

bool __thiscall
sptk::DataWindowing::Run
          (DataWindowing *this,vector<double,_std::allocator<double>_> *data,
          vector<double,_std::allocator<double>_> *windowed_data)

{
  pointer pdVar1;
  bool bVar2;
  pointer pdVar3;
  pointer pdVar4;
  long lVar5;
  long lVar6;
  
  if (this->is_valid_ == true) {
    bVar2 = false;
    if (windowed_data != (vector<double,_std::allocator<double>_> *)0x0) {
      pdVar4 = (data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      lVar5 = (long)this->input_length_;
      bVar2 = false;
      if ((long)(data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)pdVar4 >> 3 == lVar5) {
        pdVar3 = (windowed_data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        if ((long)(windowed_data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_finish - (long)pdVar3 >> 3 !=
            (long)this->output_length_) {
          std::vector<double,_std::allocator<double>_>::resize
                    (windowed_data,(long)this->output_length_);
          pdVar4 = (data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          lVar5 = (long)this->input_length_;
          pdVar3 = (windowed_data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start;
        }
        pdVar1 = (this->window_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        for (lVar6 = 0; lVar5 * 8 - lVar6 != 0; lVar6 = lVar6 + 8) {
          *(double *)((long)pdVar3 + lVar6) =
               *(double *)((long)pdVar4 + lVar6) * *(double *)((long)pdVar1 + lVar6);
        }
        pdVar4 = (windowed_data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
        for (pdVar3 = pdVar3 + lVar5; pdVar3 != pdVar4; pdVar3 = pdVar3 + 1) {
          *pdVar3 = 0.0;
        }
        bVar2 = true;
      }
    }
    return bVar2;
  }
  return false;
}

Assistant:

bool DataWindowing::Run(const std::vector<double>& data,
                        std::vector<double>* windowed_data) const {
  // Check inputs.
  if (!is_valid_ || data.size() != static_cast<std::size_t>(input_length_) ||
      NULL == windowed_data) {
    return false;
  }

  // Prepare memories.
  if (windowed_data->size() != static_cast<std::size_t>(output_length_)) {
    windowed_data->resize(output_length_);
  }

  // Apply window.
  std::transform(data.begin(), data.begin() + input_length_, window_.begin(),
                 windowed_data->begin(),
                 [](double x, double w) { return x * w; });

  // Fill zero.
  std::fill(windowed_data->begin() + input_length_, windowed_data->end(), 0.0);

  return true;
}